

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

SegmentWordCount capnp::_::verifySegmentSize(size_t size)

{
  unsigned_long uVar1;
  anon_class_8_1_89918cff local_20;
  unsigned_long local_18;
  unsigned_long gsize;
  size_t size_local;
  
  gsize = size;
  local_18 = bounded<unsigned_long>(size);
  local_20.size = &gsize;
  uVar1 = assertMaxBits<29u,unsigned_long,capnp::_::verifySegmentSize(unsigned_long)::__0>
                    (local_18,&local_20);
  return (SegmentWordCount)uVar1;
}

Assistant:

static SegmentWordCount verifySegmentSize(size_t size) {
  auto gsize = bounded(size) * WORDS;
  return assertMaxBits<SEGMENT_WORD_COUNT_BITS>(gsize, [&]() {
    KJ_FAIL_REQUIRE("segment is too large", size);
  });
}